

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Token>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  bool bVar6;
  Token value;
  char c;
  string local_78;
  undefined4 local_54;
  string local_50;
  
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (result,(result->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                    _M_impl.super__Vector_impl_data._M_start);
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    local_54 = (undefined4)CONCAT71(in_register_00000011,end_symbol);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    bVar2 = ReadBasicType(this,(token *)&local_78);
    if (bVar2) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                (result,(value_type *)&local_78);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar4 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar4) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      do {
        pSVar1 = this->_sr;
        if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
        goto LAB_00399f7a;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,(char *)&local_50);
        cVar5 = '\x01';
        if (bVar2) {
          if ((char)local_50._M_dataplus._M_p == sep) {
            bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar2) {
              bVar2 = LookChar1(this,(char *)&local_78);
              bVar6 = (char)local_78._M_dataplus._M_p == (char)local_54;
              cVar5 = bVar6 * '\x03';
              if (!bVar2) {
                cVar5 = '\x01';
              }
              if (!bVar6 && bVar2) goto LAB_00399ee1;
            }
          }
          else {
LAB_00399ee1:
            if ((char)local_50._M_dataplus._M_p == sep) {
              cVar5 = '\x01';
              bVar2 = SkipWhitespaceAndNewline(this,true);
              if (bVar2) {
                local_78._M_string_length = 0;
                local_78.field_2._M_local_buf[0] = '\0';
                local_78._M_dataplus._M_p = (pointer)paVar4;
                bVar2 = ReadBasicType(this,(token *)&local_78);
                cVar5 = '\x03';
                if (bVar2) {
                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                            (result,(value_type *)&local_78);
                  cVar5 = '\0';
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != paVar4) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                           local_78.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            else {
              pSVar1 = this->_sr;
              cVar5 = '\x03';
              if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_))
              {
                pSVar1->idx_ = uVar3;
              }
            }
          }
        }
      } while (cVar5 == '\0');
      if (cVar5 != '\x01') {
LAB_00399f7a:
        if ((result->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
        local_78._M_dataplus._M_p = (pointer)paVar4;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Empty array.\n","");
        PushError(this,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar4) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}